

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headerssync.cpp
# Opt level: O2

void __thiscall HeadersSyncState::Finalize(HeadersSyncState *this)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ClearShrink<bitdeque<32768>>(&this->m_header_commitments);
  CBlockHeader::SetNull(&this->m_last_header_received);
  ClearShrink<std::deque<CompressedHeader,std::allocator<CompressedHeader>>>
            (&this->m_redownloaded_headers);
  base_blob<256U>::SetNull(&(this->m_redownload_buffer_last_hash).super_base_blob<256U>);
  base_blob<256U>::SetNull(&(this->m_redownload_buffer_first_prev_hash).super_base_blob<256U>);
  this->m_process_all_remaining_headers = false;
  this->m_current_height = 0;
  this->m_download_state = FINAL;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void HeadersSyncState::Finalize()
{
    Assume(m_download_state != State::FINAL);
    ClearShrink(m_header_commitments);
    m_last_header_received.SetNull();
    ClearShrink(m_redownloaded_headers);
    m_redownload_buffer_last_hash.SetNull();
    m_redownload_buffer_first_prev_hash.SetNull();
    m_process_all_remaining_headers = false;
    m_current_height = 0;

    m_download_state = State::FINAL;
}